

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall DISTRHO::String::~String(String *this)

{
  if (this->fBuffer != (char *)0x0) {
    if (this->fBufferAlloc == true) {
      free(this->fBuffer);
    }
    this->fBuffer = (char *)0x0;
    this->fBufferLen = 0;
    this->fBufferAlloc = false;
    return;
  }
  d_safe_assert("fBuffer != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/../extra/String.hpp"
                ,0xf2);
  return;
}

Assistant:

~String() noexcept
    {
        DISTRHO_SAFE_ASSERT_RETURN(fBuffer != nullptr,);

        if (fBufferAlloc)
            std::free(fBuffer);

        fBuffer      = nullptr;
        fBufferLen   = 0;
        fBufferAlloc = false;
    }